

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

bool P_TeleportMove(AActor *thing,DVector3 *pos,bool telefrag,bool modifyactor)

{
  sector_t *psVar1;
  double dVar2;
  bool bVar3;
  subsector_t *psVar4;
  AActor *pAVar5;
  bool bVar6;
  FPortalGroupArray grouplist;
  CheckResult cres2;
  CheckResult cres;
  FMultiBlockLinesIterator mit;
  FMultiBlockThingsIterator mit2;
  FName local_3a4;
  int local_3a0;
  int local_39c;
  sector_t *local_398;
  sector_t *local_390;
  double local_388;
  DAngle local_380;
  FPortalGroupArray local_378;
  CheckResult local_350;
  FCheckPosition local_328;
  CheckResult local_290;
  FMultiBlockLinesIterator local_268;
  FMultiBlockThingsIterator local_1d0;
  
  local_328.LastRipped.NumUsed = 0;
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::SetNodeVector
            (&local_328.LastRipped,1);
  local_328.DoRipping = false;
  local_328.PushTime = 0;
  local_328.FromPMove = false;
  psVar1 = thing->Sector;
  local_328.pos.Z = pos->Z;
  local_328.pos.X = pos->X;
  local_328.pos.Y = pos->Y;
  local_328.touchmidtex = false;
  local_328.abovemidtex = false;
  local_328.thing = thing;
  P_GetFloorCeilingZ(&local_328,0);
  if (spechit.Count != 0) {
    spechit.Count = 0;
  }
  if ((((thing->flags2).Value & 0x40000) != 0) || ((level.flags._1_1_ & 4) != 0 || telefrag)) {
    bVar6 = ((thing->flags7).Value & 2) == 0;
  }
  else {
    bVar6 = false;
  }
  local_388 = (thing->__Pos).Z;
  (thing->__Pos).Z = pos->Z;
  psVar4 = P_PointInSubsector(pos->X,pos->Y);
  local_390 = psVar4->sector;
  local_378.data.Array = (unsigned_short *)0x0;
  local_378.data.Most = 0;
  local_378.data.Count = 0;
  local_378.method = 1;
  local_378.varused = '\0';
  local_378.inited = false;
  local_398 = psVar1;
  FMultiBlockLinesIterator::FMultiBlockLinesIterator
            (&local_268,&local_378,pos->X,pos->Y,pos->Z,thing->Height,thing->radius,local_390);
  while (bVar3 = FMultiBlockLinesIterator::Next(&local_268,&local_290), bVar3) {
    PIT_FindFloorCeiling(&local_268,&local_290,&local_268.bbox,&local_328,0);
  }
  (thing->__Pos).Z = local_388;
  if (local_328.touchmidtex == true) {
    local_328.dropoffz = local_328.floorz;
  }
  FMultiBlockThingsIterator::FMultiBlockThingsIterator
            (&local_1d0,&local_378,pos->X,pos->Y,pos->Z,thing->Height,thing->radius,false,local_390)
  ;
LAB_00538a06:
  bVar3 = FMultiBlockThingsIterator::Next(&local_1d0,&local_350);
  pAVar5 = local_350.thing;
  if (bVar3) {
    if ((((local_350.thing != thing) && ((((local_350.thing)->flags).Value & 4) != 0)) &&
        (dVar2 = (local_350.thing)->radius + (local_328.thing)->radius,
        ABS(((local_350.thing)->__Pos).X - local_350.Position.X) < dVar2)) &&
       ((ABS(((local_350.thing)->__Pos).Y - local_350.Position.Y) < dVar2 &&
        (((((local_350.thing)->flags2).Value | ((local_328.thing)->flags2).Value) >> 0x14 & 1) == 0)
        ))) {
      if ((((local_328.thing)->flags6).Value & 2) != 0) {
        (*((local_328.thing)->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_39c);
        (*(pAVar5->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_3a0,pAVar5);
        if (local_39c == local_3a0) goto LAB_00538a06;
      }
      if (((((thing->flags2).Value & 0x1000) != 0) || (((pAVar5->flags4).Value & 0x80) != 0)) &&
         ((((byte)i_compatflags & 0x10) == 0 &&
          ((((thing->flags3).Value & (pAVar5->flags3).Value) >> 8 & 1) == 0)))) {
        dVar2 = (pAVar5->__Pos).Z;
        if ((pAVar5->Height + dVar2 < pos->Z) || (pos->Z + thing->Height < dVar2))
        goto LAB_00538a06;
      }
      if (((!bVar6) || (((pAVar5->flags6).Value & 0x100) != 0)) &&
         (((pAVar5->flags7).Value & 4) == 0)) goto LAB_00538cbb;
      if ((thing->player == (player_t *)0x0) || ((thing->player->cheats & 0x2000) == 0)) {
        local_3a4.Index = 0xbc;
        local_380.Degrees = 0.0;
        P_DamageMobj(pAVar5,thing,thing,1000000,&local_3a4,4,&local_380);
      }
    }
    goto LAB_00538a06;
  }
  if (!modifyactor) goto LAB_00538cbb;
  (*(thing->super_DThinker).super_DObject._vptr_DObject[0x22])
            (SUB84(pos->X,0),pos->Y,pos->Z,thing,0);
  thing->floorz = local_328.floorz;
  thing->ceilingz = local_328.ceilingz;
  thing->floorsector = local_328.floorsector;
  thing->floorpic = (FTextureID)local_328.floorpic.texnum;
  thing->floorterrain = local_328.floorterrain;
  thing->ceilingsector = local_328.ceilingsector;
  (thing->ceilingpic).texnum = local_328.ceilingpic.texnum;
  thing->dropoffz = local_328.dropoffz;
  thing->BlockingLine = (line_t *)0x0;
  if (((thing->flags2).Value & 0x20) != 0) {
    AActor::AdjustFloorClip(thing);
  }
  pAVar5 = (AActor *)(&DAT_00a60408)[(long)consoleplayer * 0x54];
  if (pAVar5 == (AActor *)0x0) {
LAB_00538c86:
    pAVar5 = (AActor *)0x0;
  }
  else if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (&DAT_00a60408)[(long)consoleplayer * 0x54] = 0;
    goto LAB_00538c86;
  }
  if (pAVar5 == thing) {
    R_ResetViewInterpolation();
  }
  if ((i_compatflags2 & 0x20U) == 0 && ((thing->flags6).Value & 0x10000000) == 0) {
    AActor::CheckSectorTransition(thing,local_398);
  }
LAB_00538cbb:
  TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
            (&local_1d0.blockIterator.DynHash);
  TArray<unsigned_short,_unsigned_short>::~TArray(&local_378.data);
  M_Free(local_328.LastRipped.Nodes);
  return !bVar3;
}

Assistant:

bool	P_TeleportMove(AActor* thing, const DVector3 &pos, bool telefrag, bool modifyactor) 
{
	FCheckPosition tmf;
	sector_t *oldsec = thing->Sector;

	// kill anything occupying the position


	// The base floor/ceiling is from the subsector that contains the point.
	// Any contacted lines the step closer together will adjust them.
	tmf.thing = thing;
	tmf.pos = pos;
	tmf.touchmidtex = false;
	tmf.abovemidtex = false;
	P_GetFloorCeilingZ(tmf, 0);

	spechit.Clear();	// this is needed so that no more specials get activated after crossing a teleporter.

	bool StompAlwaysFrags = ((thing->flags2 & MF2_TELESTOMP) || (level.flags & LEVEL_MONSTERSTELEFRAG) || telefrag) && !(thing->flags7 & MF7_NOTELESTOMP);

	// P_LineOpening requires the thing's z to be the destination z in order to work.
	double savedz = thing->Z();
	thing->SetZ(pos.Z);
	sector_t *sector = P_PointInSector(pos);

	FPortalGroupArray grouplist;
	FMultiBlockLinesIterator mit(grouplist, pos.X, pos.Y, pos.Z, thing->Height, thing->radius, sector);
	FMultiBlockLinesIterator::CheckResult cres;

	while (mit.Next(&cres))
	{
		PIT_FindFloorCeiling(mit, cres, mit.Box(), tmf, 0);
	}
	thing->SetZ(savedz);

	if (tmf.touchmidtex) tmf.dropoffz = tmf.floorz;

	FMultiBlockThingsIterator mit2(grouplist, pos.X, pos.Y, pos.Z, thing->Height, thing->radius, false, sector);
	FMultiBlockThingsIterator::CheckResult cres2;

	while (mit2.Next(&cres2))
	{
		AActor *th = cres2.thing;

		if (!(th->flags & MF_SHOOTABLE))
			continue;

		// don't clip against self
		if (th == thing)
			continue;

		double blockdist = th->radius + tmf.thing->radius;
		if (fabs(th->X() - cres2.Position.X) >= blockdist || fabs(th->Y() - cres2.Position.Y) >= blockdist)
			continue;

		if ((th->flags2 | tmf.thing->flags2) & MF2_THRUACTORS)
			continue;

		if (tmf.thing->flags6 & MF6_THRUSPECIES && tmf.thing->GetSpecies() == th->GetSpecies())
			continue;

		// [RH] Z-Check
		// But not if not MF2_PASSMOBJ or MF3_DONTOVERLAP are set!
		// Otherwise those things would get stuck inside each other.
		if ((thing->flags2 & MF2_PASSMOBJ || th->flags4 & MF4_ACTLIKEBRIDGE) && !(i_compatflags & COMPATF_NO_PASSMOBJ))
		{
			if (!(th->flags3 & thing->flags3 & MF3_DONTOVERLAP))
			{
				if (pos.Z > th->Top() ||	// overhead
					pos.Z + thing->Height < th->Z())	// underneath
					continue;
			}
		}

		// monsters don't stomp things except on boss level
		// [RH] Some Heretic/Hexen monsters can telestomp
		// ... and some items can never be telefragged while others will be telefragged by everything that teleports upon them.
		if ((StompAlwaysFrags && !(th->flags6 & MF6_NOTELEFRAG)) || (th->flags7 & MF7_ALWAYSTELEFRAG))
		{
			// Don't actually damage if predicting a teleport
			if (thing->player == NULL || !(thing->player->cheats & CF_PREDICTING))
				P_DamageMobj(th, thing, thing, TELEFRAG_DAMAGE, NAME_Telefrag, DMG_THRUSTLESS);
			continue;
		}
		return false;
	}

	if (modifyactor)
	{
		// the move is ok, so link the thing into its new position
		thing->SetOrigin(pos, false);
		thing->floorz = tmf.floorz;
		thing->ceilingz = tmf.ceilingz;
		thing->floorsector = tmf.floorsector;
		thing->floorpic = tmf.floorpic;
		thing->floorterrain = tmf.floorterrain;
		thing->ceilingsector = tmf.ceilingsector;
		thing->ceilingpic = tmf.ceilingpic;
		thing->dropoffz = tmf.dropoffz;        // killough 11/98
		thing->BlockingLine = NULL;

		if (thing->flags2 & MF2_FLOORCLIP)
		{
			thing->AdjustFloorClip();
		}

		if (thing == players[consoleplayer].camera)
		{
			R_ResetViewInterpolation();
		}

		// If this teleport was caused by a move, P_TryMove() will handle the
		// sector transition messages better than we can here.
		// This needs to be compatibility optioned because some older maps exploited this missing feature.
		if (!(thing->flags6 & MF6_INTRYMOVE) && !(i_compatflags2 & COMPATF2_TELEPORT))
		{
			thing->CheckSectorTransition(oldsec);
		}
	}

	return true;
}